

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O0

void __thiscall tcu::Vector<tcu::Interval,_4>::Vector(Vector<tcu::Interval,_4> *this)

{
  Interval *pIVar1;
  Interval *local_38;
  Interval local_30;
  int local_14;
  Vector<tcu::Interval,_4> *pVStack_10;
  int i;
  Vector<tcu::Interval,_4> *this_local;
  
  local_38 = this->m_data;
  pVStack_10 = this;
  do {
    Interval::Interval(local_38);
    local_38 = local_38 + 1;
  } while (local_38 != this[1].m_data);
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    Interval::Interval(&local_30);
    pIVar1 = this->m_data + local_14;
    pIVar1->m_hasNaN = local_30.m_hasNaN;
    *(undefined7 *)&pIVar1->field_0x1 = local_30._1_7_;
    pIVar1->m_lo = local_30.m_lo;
    pIVar1->m_hi = local_30.m_hi;
  }
  return;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}